

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O2

void __thiscall userDefinedUnits_fileOp4_Test::TestBody(userDefinedUnits_fileOp4_Test *this)

{
  uint64_t uVar1;
  precise_unit *ppVar2;
  precise_unit *ppVar3;
  pointer *__ptr;
  char *pcVar4;
  char *in_R9;
  precise_unit pVar5;
  AssertHelper local_168;
  precise_unit y4;
  AssertionResult gtest_ar_5;
  precise_unit y3;
  precise_unit y2;
  AssertHelper local_110;
  precise_unit HgV;
  precise_unit auV;
  precise_unit agV;
  precise_unit FeV;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  precise_unit y1;
  string outputstr;
  
  std::__cxx11::string::string
            ((string *)&y4,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/files/test_unit_files/other_units4.txt"
             ,(allocator *)&agV);
  units::definedUnitsFromFile(&outputstr,(string *)&y4);
  std::__cxx11::string::~string((string *)&y4);
  agV.base_units_ = (unit_data)0x0;
  agV.commodity_ = 0;
  agV.multiplier_ = (double)CONCAT71(agV.multiplier_._1_7_,outputstr._M_string_length == 0);
  if (outputstr._M_string_length != 0) {
    testing::Message::Message((Message *)&auV);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&y4,(internal *)&agV,(AssertionResult *)"outputstr.empty()","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&HgV,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x67c,(char *)y4.multiplier_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&HgV,(Message *)&auV);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&HgV);
    std::__cxx11::string::~string((string *)&y4);
    if (auV.multiplier_ != 0.0) {
      (**(code **)(*(long *)auV.multiplier_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&agV.base_units_);
  agV.multiplier_ = 12.2;
  agV.base_units_ = (unit_data)0x39d2;
  agV.commodity_ = 0;
  auV.multiplier_ = 14.2;
  auV.base_units_ = (unit_data)0x39d2;
  auV.commodity_ = 0;
  HgV.multiplier_ = 17.7;
  HgV.base_units_ = (unit_data)0x39d2;
  HgV.commodity_ = 0;
  FeV.multiplier_ = 17.7;
  FeV.base_units_ = (unit_data)0x39d2;
  FeV.commodity_ = 0;
  std::__cxx11::string::string((string *)&local_68,"agV",(allocator *)&y4);
  uVar1 = units::getDefaultFlags();
  pVar5 = units::unit_from_string(&local_68,uVar1);
  y1._8_8_ = pVar5._8_8_;
  ppVar3 = &y1;
  y1.multiplier_ = pVar5.multiplier_;
  std::__cxx11::string::~string((string *)&local_68);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)&y4,"y1","agV",ppVar3,&agV);
  if (y4.multiplier_._0_1_ == '\0') {
    testing::Message::Message((Message *)&y2);
    if (y4._8_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)y4._8_8_;
    }
    ppVar3 = (precise_unit *)0x685;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&y3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x685,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&y3,(Message *)&y2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&y3);
    if (y2.multiplier_ != 0.0) {
      (**(code **)(*(long *)y2.multiplier_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&y4.base_units_);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_((string *)&y4,(units *)&y1,ppVar2,(uint64_t)ppVar3);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&y2,"to_string(y1)","\"agV\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&y4,
             (char (*) [4])"agV");
  std::__cxx11::string::~string((string *)&y4);
  if (y2.multiplier_._0_1_ == '\0') {
    testing::Message::Message((Message *)&y4);
    if (y2._8_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)y2._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&y3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x686,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&y3,(Message *)&y4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&y3);
    if (y4.multiplier_ != 0.0) {
      (**(code **)(*(long *)y4.multiplier_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&y2.base_units_);
  std::__cxx11::string::string((string *)&local_88,"auV",(allocator *)&y4);
  uVar1 = units::getDefaultFlags();
  pVar5 = units::unit_from_string(&local_88,uVar1);
  y2._8_8_ = pVar5._8_8_;
  ppVar3 = &y2;
  y2.multiplier_ = pVar5.multiplier_;
  std::__cxx11::string::~string((string *)&local_88);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)&y4,"y2","auV",ppVar3,&auV);
  if (y4.multiplier_._0_1_ == '\0') {
    testing::Message::Message((Message *)&y3);
    if (y4._8_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)y4._8_8_;
    }
    ppVar3 = (precise_unit *)0x689;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x689,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&y3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
    if (y3.multiplier_ != 0.0) {
      (**(code **)(*(long *)y3.multiplier_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&y4.base_units_);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_((string *)&y4,(units *)&y2,ppVar2,(uint64_t)ppVar3);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&y3,"to_string(y2)","\"auV\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&y4,
             (char (*) [4])"auV");
  std::__cxx11::string::~string((string *)&y4);
  if (y3.multiplier_._0_1_ == '\0') {
    testing::Message::Message((Message *)&y4);
    if (y3._8_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)y3._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x68a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&y4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
    if (y4.multiplier_ != 0.0) {
      (**(code **)(*(long *)y4.multiplier_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&y3.base_units_);
  std::__cxx11::string::string((string *)&local_a8,"HgV",(allocator *)&y4);
  uVar1 = units::getDefaultFlags();
  pVar5 = units::unit_from_string(&local_a8,uVar1);
  y3._8_8_ = pVar5._8_8_;
  ppVar3 = &y3;
  y3.multiplier_ = pVar5.multiplier_;
  std::__cxx11::string::~string((string *)&local_a8);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)&y4,"y3","HgV",ppVar3,&HgV);
  if (y4.multiplier_._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (y4._8_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)y4._8_8_;
    }
    ppVar3 = (precise_unit *)0x68d;
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x68d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if ((long *)CONCAT71(gtest_ar_5._1_7_,gtest_ar_5.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_5._1_7_,gtest_ar_5.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&y4.base_units_);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_((string *)&y4,(units *)&y3,ppVar2,(uint64_t)ppVar3);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&gtest_ar_5,"to_string(y3)","\"FeV\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&y4,
             (char (*) [4])"FeV");
  std::__cxx11::string::~string((string *)&y4);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&y4);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_5.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x68e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)&y4);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if (y4.multiplier_ != 0.0) {
      (**(code **)(*(long *)y4.multiplier_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_5.message_);
  std::__cxx11::string::string((string *)&local_c8,"FeV",(allocator *)&gtest_ar_5);
  uVar1 = units::getDefaultFlags();
  pVar5 = units::unit_from_string(&local_c8,uVar1);
  y4._8_8_ = pVar5._8_8_;
  y4.multiplier_ = pVar5.multiplier_;
  std::__cxx11::string::~string((string *)&local_c8);
  testing::internal::CmpHelperNE<units::precise_unit,units::precise_unit>
            ((internal *)&gtest_ar_5,"y4","FeV",&y4,&FeV);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&local_168);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_5.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x691,pcVar4);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_168.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_168.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_5.message_);
  units::clearUserDefinedUnits();
  std::__cxx11::string::~string((string *)&outputstr);
  return;
}

Assistant:

TEST(userDefinedUnits, fileOp4)
{
    auto outputstr = definedUnitsFromFile(
        TEST_FILE_FOLDER "/test_unit_files/other_units4.txt");
    EXPECT_TRUE(outputstr.empty());

    constexpr precise_unit agV(12.2, precise::V);
    constexpr precise_unit auV(14.2, precise::V);
    constexpr precise_unit HgV(17.7, precise::V);
    constexpr precise_unit FeV(17.7, precise::V);

    auto y1 = unit_from_string("agV");

    EXPECT_EQ(y1, agV);
    EXPECT_EQ(to_string(y1), "agV");

    auto y2 = unit_from_string("auV");
    EXPECT_EQ(y2, auV);
    EXPECT_EQ(to_string(y2), "auV");

    auto y3 = unit_from_string("HgV");
    EXPECT_EQ(y3, HgV);
    EXPECT_EQ(to_string(y3), "FeV");

    auto y4 = unit_from_string("FeV");
    EXPECT_NE(y4, FeV);

    clearUserDefinedUnits();
}